

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree_Item::next(Fl_Tree_Item *this)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  int iVar3;
  Fl_Tree_Item *c;
  long lVar4;
  
  if ((this->_children)._total != 0) {
    return *(this->_children)._items;
  }
  do {
    pFVar2 = this->_parent;
    if (pFVar2 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    iVar1 = (pFVar2->_children)._total;
    iVar3 = 0;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        if ((pFVar2->_children)._items[lVar4] == this) {
          iVar3 = (int)lVar4 + 1;
          break;
        }
        lVar4 = lVar4 + 1;
        iVar3 = 0;
      } while (iVar1 != lVar4);
    }
    this = pFVar2;
    if (iVar3 < iVar1) {
      return (pFVar2->_children)._items[iVar3];
    }
  } while( true );
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next() {
  Fl_Tree_Item *p, *c = this;
  if ( c->has_children() ) {
    return(c->child(0));
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    if ( c->_next_sibling )			// not last child?
      return(c->_next_sibling);			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#else /*FLTK_ABI_VERSION*/
  // OLD
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    int t = p->find_child(c);			// find our position in parent's children[] array
    if ( ++t < p->children() )			// not last child?
      return(p->child(t));			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#endif /*FLTK_ABI_VERSION*/
  return(0);					// hit root? done
}